

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O0

bool __thiscall xray_re::xr_ogf_v4::hierarchical(xr_ogf_v4 *this)

{
  ogf_model_type oVar1;
  xr_ogf_v4 *this_local;
  
  oVar1 = (this->super_xr_ogf).m_model_type;
  if ((((oVar1 == MT3_HIERRARHY) || (oVar1 == MT3_SKELETON_GEOMDEF_PM)) ||
      (oVar1 == MT3_DETAIL_PATCH)) || (oVar1 == MT3_PROGRESSIVE2)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool xr_ogf_v4::hierarchical() const
{
	switch (m_model_type) {
	case MT4_HIERRARHY:
	case MT4_SKELETON_ANIM:
	case MT4_SKELETON_RIGID:
	case MT4_LOD:
		return true;
	default:
		return false;
	}
}